

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_change_event_ensure_space_Test::TestBody(Buffer_change_event_ensure_space_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  BufferWithReadonlyStrings local;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  AssertHelper local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  BufferWithReadonlyStrings local_c8;
  
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_c8);
  bfy_buffer_set_changed_cb
            (&local_c8.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_c8.changes);
  local_e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_e8._M_head_impl._4_4_ << 0x20);
  local_e0.data_._0_4_ = bfy_buffer_ensure_space(&local_c8.buf,0x400);
  testing::internal::CmpHelperEQ<int,int>
            (local_d8,"0","bfy_buffer_ensure_space(&local.buf, 1024)",(int *)&local_e8,
             (int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x645,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_e0.data_._0_4_ = 0;
  local_e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)local_c8.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_c8.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_d8,"0","std::size(local.changes)",(int *)&local_e0,(unsigned_long *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x646,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_c8);
  return;
}

Assistant:

TEST(Buffer, change_event_ensure_space) {
    BufferWithReadonlyStrings local;

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_ensure_space(&local.buf, 1024));
    EXPECT_EQ(0, std::size(local.changes));
}